

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  int iVar1;
  int iVar2;
  DbPage *local_78;
  DbPage *pDbPage;
  Pgno *pPStack_68;
  int a_1;
  Pgno *aNew;
  int nOvfl;
  Pgno nextPage;
  u32 ovflSize;
  int a;
  BtShared *pBt;
  MemPage *pPage;
  int iIdx;
  int rc;
  uchar *aPayload;
  uchar *puStack_28;
  int eOp_local;
  uchar *pBuf_local;
  u32 amt_local;
  u32 offset_local;
  BtCursor *pCur_local;
  
  pPage._4_4_ = 0;
  pPage._0_4_ = 0;
  pBt = (BtShared *)pCur->pPage;
  _ovflSize = pCur->pBt;
  aPayload._4_4_ = eOp;
  puStack_28 = pBuf;
  pBuf_local._0_4_ = amt;
  pBuf_local._4_4_ = offset;
  _amt_local = pCur;
  getCellInfo(pCur);
  _iIdx = (_amt_local->info).pPayload;
  if ((ulong)(_ovflSize->usableSize - (uint)(_amt_local->info).nLocal) <
      (ulong)((long)_iIdx - (long)pBt->mutex)) {
    pCur_local._4_4_ = sqlite3CorruptError(0x10968);
  }
  else {
    if (pBuf_local._4_4_ < (_amt_local->info).nLocal) {
      nextPage = (u32)pBuf_local;
      if ((uint)(_amt_local->info).nLocal < (u32)pBuf_local + pBuf_local._4_4_) {
        nextPage = (_amt_local->info).nLocal - pBuf_local._4_4_;
      }
      pPage._4_4_ = copyPayload(_iIdx + pBuf_local._4_4_,puStack_28,nextPage,aPayload._4_4_,
                                (DbPage *)pBt->pLock);
      pBuf_local._4_4_ = 0;
      puStack_28 = puStack_28 + (int)nextPage;
      pBuf_local._0_4_ = (u32)pBuf_local - nextPage;
    }
    else {
      pBuf_local._4_4_ = pBuf_local._4_4_ - (_amt_local->info).nLocal;
    }
    if ((pPage._4_4_ == 0) && ((u32)pBuf_local != 0)) {
      nOvfl = _ovflSize->usableSize - 4;
      aNew._4_4_ = sqlite3Get4byte(_iIdx + (_amt_local->info).nLocal);
      if ((_amt_local->curFlags & 4) == 0) {
        aNew._0_4_ = ((((_amt_local->info).nPayload - (uint)(_amt_local->info).nLocal) + nOvfl) - 1)
                     / (uint)nOvfl;
        if ((_amt_local->aOverflow == (Pgno *)0x0) ||
           (iVar1 = (uint)aNew << 2, iVar2 = sqlite3MallocSize(_amt_local->aOverflow), iVar2 < iVar1
           )) {
          pPStack_68 = (Pgno *)sqlite3Realloc(_amt_local->aOverflow,
                                              (long)(int)((uint)aNew << 1) << 2);
          if (pPStack_68 == (Pgno *)0x0) {
            return 7;
          }
          _amt_local->aOverflow = pPStack_68;
        }
        memset(_amt_local->aOverflow,0,(long)(int)(uint)aNew << 2);
        _amt_local->curFlags = _amt_local->curFlags | 4;
      }
      else if (_amt_local->aOverflow[(ulong)pBuf_local._4_4_ / (ulong)(uint)nOvfl] != 0) {
        pPage._0_4_ = pBuf_local._4_4_ / (uint)nOvfl;
        aNew._4_4_ = _amt_local->aOverflow[(int)(uint)pPage];
        pBuf_local._4_4_ = pBuf_local._4_4_ % (uint)nOvfl;
      }
      while (aNew._4_4_ != 0) {
        _amt_local->aOverflow[(int)(uint)pPage] = aNew._4_4_;
        if (pBuf_local._4_4_ < (uint)nOvfl) {
          pDbPage._4_4_ = (u32)pBuf_local;
          if ((uint)nOvfl < (u32)pBuf_local + pBuf_local._4_4_) {
            pDbPage._4_4_ = nOvfl - pBuf_local._4_4_;
          }
          iVar1 = 0;
          if (aPayload._4_4_ == 0) {
            iVar1 = 2;
          }
          pPage._4_4_ = sqlite3PagerGet(_ovflSize->pPager,aNew._4_4_,&local_78,iVar1);
          if (pPage._4_4_ == 0) {
            _iIdx = (u8 *)sqlite3PagerGetData(local_78);
            aNew._4_4_ = sqlite3Get4byte(_iIdx);
            pPage._4_4_ = copyPayload(_iIdx + (pBuf_local._4_4_ + 4),puStack_28,pDbPage._4_4_,
                                      aPayload._4_4_,local_78);
            sqlite3PagerUnref(local_78);
            pBuf_local._4_4_ = 0;
          }
          pBuf_local._0_4_ = (u32)pBuf_local - pDbPage._4_4_;
          if ((u32)pBuf_local == 0) {
            return pPage._4_4_;
          }
          puStack_28 = puStack_28 + (int)pDbPage._4_4_;
        }
        else {
          if (_amt_local->aOverflow[(int)((uint)pPage + 1)] == 0) {
            pPage._4_4_ = getOverflowPage(_ovflSize,aNew._4_4_,(MemPage **)0x0,
                                          (Pgno *)((long)&aNew + 4));
          }
          else {
            aNew._4_4_ = _amt_local->aOverflow[(int)((uint)pPage + 1)];
          }
          pBuf_local._4_4_ = pBuf_local._4_4_ - nOvfl;
        }
        if (pPage._4_4_ != 0) break;
        pPage._0_4_ = (uint)pPage + 1;
      }
    }
    if ((pPage._4_4_ == 0) && ((u32)pBuf_local != 0)) {
      pCur_local._4_4_ = sqlite3CorruptError(0x109f9);
    }
    else {
      pCur_local._4_4_ = pPage._4_4_;
    }
  }
  return pCur_local._4_4_;
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */ 
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  int iIdx = 0;
  MemPage *pPage = pCur->pPage;               /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  unsigned char * const pBufStart = pBuf;     /* Start of original out buffer */
#endif

  assert( pPage );
  assert( eOp==0 || eOp==1 );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->ix<pPage->nCell );
  assert( cursorHoldsMutex(pCur) );

  getCellInfo(pCur);
  aPayload = pCur->info.pPayload;
  assert( offset+amt <= pCur->info.nPayload );

  assert( aPayload > pPage->aData );
  if( (uptr)(aPayload - pPage->aData) > (pBt->usableSize - pCur->info.nLocal) ){
    /* Trying to read or write past the end of the data is an error.  The
    ** conditional above is really:
    **    &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize]
    ** but is recast into its current form to avoid integer overflow problems
    */
    return SQLITE_CORRUPT_PAGE(pPage);
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, eOp, pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }


  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

    /* If the BtCursor.aOverflow[] has not been allocated, allocate it now.
    **
    ** The aOverflow[] array is sized at one entry for each overflow page
    ** in the overflow chain. The page number of the first overflow page is
    ** stored in aOverflow[0], etc. A value of 0 in the aOverflow[] array
    ** means "not yet known" (the cache is lazily populated).
    */
    if( (pCur->curFlags & BTCF_ValidOvfl)==0 ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      if( pCur->aOverflow==0
       || nOvfl*(int)sizeof(Pgno) > sqlite3MallocSize(pCur->aOverflow)
      ){
        Pgno *aNew = (Pgno*)sqlite3Realloc(
            pCur->aOverflow, nOvfl*2*sizeof(Pgno)
        );
        if( aNew==0 ){
          return SQLITE_NOMEM_BKPT;
        }else{
          pCur->aOverflow = aNew;
        }
      }
      memset(pCur->aOverflow, 0, nOvfl*sizeof(Pgno));
      pCur->curFlags |= BTCF_ValidOvfl;
    }else{
      /* If the overflow page-list cache has been allocated and the
      ** entry for the first required overflow page is valid, skip
      ** directly to it.
      */
      if( pCur->aOverflow[offset/ovflSize] ){
        iIdx = (offset/ovflSize);
        nextPage = pCur->aOverflow[iIdx];
        offset = (offset%ovflSize);
      }
    }

    assert( rc==SQLITE_OK && amt>0 );
    while( nextPage ){
      /* If required, populate the overflow page-list cache. */
      assert( pCur->aOverflow[iIdx]==0
              || pCur->aOverflow[iIdx]==nextPage
              || CORRUPT_DB );
      pCur->aOverflow[iIdx] = nextPage;

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        */
        assert( pCur->curFlags & BTCF_ValidOvfl );
        assert( pCur->pBtree->db==pBt->db );
        if( pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        }else{
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        }
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and 
        **   2) data is required from the start of this overflow page, and
        **   3) there are no dirty pages in the page-cache
        **   4) the database is file-backed, and
        **   5) the page is not in the WAL file
        **   6) at least 4 bytes have already been read into the output buffer 
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( eOp==0                                             /* (1) */
         && offset==0                                          /* (2) */
         && sqlite3PagerDirectReadOk(pBt->pPager, nextPage)    /* (3,4,5) */
         && &pBuf[-4]>=pBufStart                               /* (6) */
        ){
          sqlite3_file *fd = sqlite3PagerFile(pBt->pPager);
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          assert( aWrite>=pBufStart );                         /* due to (6) */
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerGet(pBt->pPager, nextPage, &pDbPage,
              (eOp==0 ? PAGER_GET_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, eOp, pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        if( amt==0 ) return rc;
        pBuf += a;
      }
      if( rc ) break;
      iIdx++;
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    /* Overflow chain ends prematurely */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  return rc;
}